

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pid.c
# Opt level: O1

void PID_Increment_Calc(PID_Increment_t *PID_Increment)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  
  fVar1 = PID_Increment->MaxIncrease;
  fVar3 = PID_Increment->Ref - PID_Increment->Feedback;
  fVar2 = PID_Increment->LastError;
  PID_Increment->PrevError = fVar2;
  fVar4 = PID_Increment->Error;
  PID_Increment->LastError = fVar4;
  PID_Increment->Error = fVar3;
  fVar4 = ((fVar3 - (fVar4 + fVar4)) + fVar2) * PID_Increment->Kd +
          (fVar3 - fVar4) * PID_Increment->Kp + PID_Increment->Ki * fVar3;
  fVar2 = fVar1;
  if ((fVar1 < fVar4) || (fVar2 = -fVar1, fVar4 < -fVar1)) {
    fVar4 = fVar2;
  }
  fVar4 = fVar4 + PID_Increment->Output;
  fVar1 = PID_Increment->MaxOutput;
  fVar2 = fVar1;
  if ((fVar1 < fVar4) || (fVar2 = -fVar1, fVar4 < -fVar1)) {
    fVar4 = fVar2;
  }
  PID_Increment->Output = fVar4;
  return;
}

Assistant:

void PID_Increment_Calc(PID_Increment_t *PID_Increment)
{
	static float Error = 0.0f, DeltaOutput = 0.0f, Output = 0.0f;
	Error = PID_Increment->Ref - PID_Increment->Feedback;
	PID_Increment->PrevError = PID_Increment->LastError;
	PID_Increment->LastError = PID_Increment->Error;
	PID_Increment->Error = Error;
	DeltaOutput = PID_Increment->Kp * (PID_Increment->Error - PID_Increment->LastError) + PID_Increment->Ki * PID_Increment->Error + PID_Increment->Kd * (PID_Increment->Error - 2 * PID_Increment->LastError + PID_Increment->PrevError);
	absLimit(&DeltaOutput, PID_Increment->MaxIncrease);
	Output = PID_Increment->Output + DeltaOutput;
	absLimit(&Output, PID_Increment->MaxOutput);
	PID_Increment->Output = Output;
}